

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

int cargo_parse(cargo_t ctx,cargo_flags_t flags,int start_index,int argc,char **argv)

{
  cargo_group_t *g;
  cargo_flags_t cVar1;
  int iVar2;
  cargo_opt_t *pcVar3;
  size_t *psVar4;
  size_t sVar5;
  undefined8 uVar6;
  cargo_highlight_t *pcVar7;
  cargo_parse_result_t cVar8;
  cargo_flags_t cVar9;
  char **ppcVar10;
  int *piVar11;
  char *pcVar12;
  char *pcVar13;
  size_t sVar14;
  char *pcVar15;
  ulong uVar16;
  cargo_parse_result_t cVar17;
  size_t sVar18;
  size_t sVar19;
  char **ppcVar20;
  size_t sVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  bool bVar25;
  cargo_highlight_t *local_78;
  cargo_opt_t *opt;
  char **local_68;
  cargo_astr_t local_60;
  cargo_opt_t *local_40;
  cargo_highlight_t *local_38;
  
  uVar16 = (ulong)(uint)argc;
  opt = (cargo_opt_t *)0x0;
  cVar1 = ctx->flags;
  if (flags != 0) {
    ctx->flags = flags;
  }
  ctx->argc = argc;
  ctx->argv = argv;
  ctx->start = start_index;
  ctx->stopped = 0;
  ctx->stopped_hard = 0;
  local_68 = &ctx->error;
  ppcVar20 = argv;
  _cargo_xfree(local_68);
  ctx->error = (char *)0x0;
  _cargo_add_help_if_missing(ctx);
  _cargo_add_orphans_to_default_group(ctx);
  _cargo_free_str_list(&ctx->args,(size_t *)0x0);
  ctx->arg_count = 0;
  _cargo_free_str_list(&ctx->unknown_opts,(size_t *)0x0);
  _cargo_xfree(&ctx->unknown_opts_idxs);
  ctx->unknown_opts_count = 0;
  _cargo_cleanup_option_values(ctx,0);
  sVar18 = (size_t)argc;
  ppcVar10 = (char **)_cargo_calloc(sVar18,8);
  ctx->args = ppcVar10;
  cVar8 = CARGO_PARSE_NOMEM;
  if (ppcVar10 != (char **)0x0) {
    ppcVar10 = (char **)_cargo_calloc(sVar18,8);
    ctx->unknown_opts = ppcVar10;
    if (ppcVar10 != (char **)0x0) {
      piVar11 = (int *)_cargo_calloc(sVar18,4);
      ctx->unknown_opts_idxs = piVar11;
      if (piVar11 != (int *)0x0) {
        if (((ctx->flags & (CARGO_SKIP_CHECK_UNKNOWN|CARGO_UNKNOWN_EARLY)) != CARGO_UNKNOWN_EARLY)
           || (cVar8 = _cargo_check_unknown_options(ctx), cVar8 == CARGO_PARSE_OK)) {
          iVar22 = ctx->start;
          while (ctx->i = iVar22, iVar22 < ctx->argc) {
            pcVar3 = opt;
            if (ctx->stopped == 0) {
              pcVar15 = argv[iVar22];
              pcVar12 = _cargo_find_full_option(ctx,&opt,pcVar15);
              if (pcVar12 == (char *)0x0) {
                pcVar13 = _cargo_is_arg_combined_option(ctx,pcVar15);
                if (pcVar13 == (char *)0x0) {
                  uVar16 = ctx->opt_count;
                  opt = ctx->options;
                  while (bVar25 = uVar16 != 0, uVar16 = uVar16 - 1, pcVar3 = ctx->options, bVar25) {
                    if ((opt->positional != 0) && (opt->num_eaten != opt->nargs)) goto LAB_0010a29c;
                    opt = opt + 1;
                  }
                  goto LAB_0010a26c;
                }
                cVar8 = CARGO_PARSE_OK;
                uVar23 = 1;
                while (sVar14 = strlen(pcVar15), uVar23 < sVar14) {
                  pcVar12 = _cargo_find_short_option(ctx,&opt,pcVar15[uVar23]);
                  if (pcVar12 == (char *)0x0) {
                    __assert_fail("combined != NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                                  ,0x1456,
                                  "int cargo_parse(cargo_t, cargo_flags_t, int, int, char **)");
                  }
                  cVar8 = _cargo_parse_option(ctx,opt,pcVar12,(int)uVar16,ppcVar20);
                  uVar23 = uVar23 + 1;
                  if (cVar8 < CARGO_PARSE_OK) goto LAB_0010a203;
                }
              }
              else {
LAB_0010a29c:
                cVar8 = _cargo_parse_option(ctx,opt,pcVar12,(int)uVar16,ppcVar20);
                if (cVar8 < CARGO_PARSE_OK) goto LAB_0010a203;
              }
            }
            else {
LAB_0010a26c:
              opt = pcVar3;
              _cargo_add_extra_arg(ctx);
              cVar8 = CARGO_PARSE_SHOW_HELP;
            }
            iVar22 = cVar8 + (uint)(cVar8 == CARGO_PARSE_OK) + ctx->i;
          }
          if (ctx->help != 0) {
            cargo_print_usage(ctx,CARGO_USAGE_FULL);
            cVar17 = CARGO_PARSE_SHOW_HELP;
            goto LAB_0010a237;
          }
          cVar17 = CARGO_PARSE_OK;
          if (ctx->stopped_hard != 0) goto LAB_0010a237;
          cVar9 = ctx->flags;
          if ((cVar9 >> 0xb & 1) == 0) {
            local_60.s = (char **)&local_78;
            local_78 = (cargo_highlight_t *)0x0;
            local_60.diff = 0;
            local_60.l = 0;
            local_60.offset = 0;
            sVar18 = ctx->opt_count;
            lVar24 = 0xe0;
            while (bVar25 = sVar18 != 0, sVar18 = sVar18 - 1, bVar25) {
              pcVar3 = ctx->options;
              if (((*(byte *)((long)pcVar3->name + lVar24 + -8) & 2) != 0) &&
                 (*(int *)((long)pcVar3->name + lVar24) != 0)) {
                cargo_aappendf(&local_60,"Missing required argument \"%s\"\n",
                               *(undefined8 *)((long)pcVar3 + lVar24 + -0xe0));
LAB_0010a663:
                ppcVar20 = local_68;
                pcVar7 = local_78;
                _cargo_xfree(local_68);
                *ppcVar20 = (char *)pcVar7;
                cVar8 = CARGO_PARSE_MISS_REQUIRED;
                goto LAB_0010a203;
              }
              if (-1 < *(int *)((long)pcVar3->name + lVar24 + -0xc)) {
                iVar22 = *(int *)((long)pcVar3 + lVar24 + -0xa0);
                if (iVar22 == -1) {
                  if (*(int *)((long)pcVar3->name + lVar24 + -4) == 0) goto LAB_0010a63d;
                }
                else if ((-1 < iVar22) &&
                        (iVar2 = *(int *)((long)pcVar3->name + lVar24 + -4), iVar2 != iVar22)) {
                  if (iVar2 != 0) {
                    uVar6 = *(undefined8 *)((long)pcVar3 + lVar24 + -0xe0);
                    pcVar15 = _cargo_nargs_str(iVar22);
                    cargo_aappendf(&local_60,
                                   "Not enough arguments for \"%s\" expected %s but got only %d\n",
                                   uVar6,pcVar15,(ulong)*(uint *)((long)pcVar3->name + lVar24 + -4))
                    ;
                    goto LAB_0010a663;
                  }
LAB_0010a63d:
                  uVar6 = *(undefined8 *)((long)pcVar3 + lVar24 + -0xe0);
                  pcVar15 = _cargo_nargs_str(iVar22);
                  cargo_aappendf(&local_60,
                                 "Not enough arguments for \"%s\" expected %s but got none\n",uVar6,
                                 pcVar15);
                  goto LAB_0010a663;
                }
              }
              lVar24 = lVar24 + 0x128;
            }
          }
          if ((cVar9 >> 0xc & 1) == 0) {
            local_60.s = (char **)&local_38;
            local_38 = (cargo_highlight_t *)0x0;
            local_60.l = 0;
            local_60.offset = 0;
            local_60.diff = 0;
            for (uVar16 = 0; uVar16 < ctx->mutex_group_count; uVar16 = uVar16 + 1) {
              g = ctx->mutex_groups + uVar16;
              if ((ctx->mutex_groups[uVar16].flags & 0x30) == 0) {
                local_78 = (cargo_highlight_t *)_cargo_calloc(g->opt_count,0x10);
                if (local_78 != (cargo_highlight_t *)0x0) {
                  sVar18 = g->opt_count;
                  uVar23 = 0;
                  sVar21 = 0;
                  for (sVar19 = 0; sVar18 != sVar19; sVar19 = sVar19 + 1) {
                    pcVar3 = ctx->options;
                    sVar5 = g->option_indices[sVar19];
                    iVar22 = pcVar3[sVar5].parsed;
                    if (-1 < iVar22) {
                      local_78[uVar23].i = iVar22;
                      local_78[uVar23].c = "~\x1b[22;31m";
                      sVar21 = sVar21 + 1;
                    }
                    uVar23 = uVar23 + (pcVar3[sVar5].first_parse == 0);
                  }
                  if (uVar23 < 2) {
                    if ((uVar23 != 0) || ((g->flags & 1) == 0)) goto LAB_0010a5a7;
                    pcVar15 = "One of these variables is required:\n";
                  }
                  else {
                    _cargo_print_mutex_group_highlights(ctx,&local_60,local_78,sVar21);
                    pcVar15 = "Only one of these variables is allowed at the same time:\n";
                  }
                  cargo_aappendf(&local_60,pcVar15);
                  _cargo_print_mutex_group(ctx,0,&local_60,g);
                }
                _cargo_xfree(&local_78);
                cVar8 = CARGO_PARSE_MUTEX_CONFLICT;
LAB_0010a72c:
                pcVar7 = local_38;
                ppcVar20 = local_68;
                _cargo_xfree(local_68);
                *ppcVar20 = (char *)pcVar7;
                goto LAB_0010a203;
              }
              if (g->opt_count != 0) {
                local_78 = (cargo_highlight_t *)_cargo_calloc(g->opt_count,0x10);
                if (local_78 != (cargo_highlight_t *)0x0) {
                  psVar4 = g->option_indices;
                  sVar18 = *psVar4;
                  pcVar3 = ctx->options;
                  local_40 = pcVar3 + sVar18;
                  iVar22 = pcVar3[sVar18].parsed;
                  local_78->i = iVar22;
                  local_78->c = "^\x1b[22;32m";
                  uVar23 = g->opt_count;
                  sVar18 = 1;
                  for (sVar21 = sVar18; sVar21 < uVar23; sVar21 = sVar21 + 1) {
                    iVar2 = pcVar3[psVar4[sVar21]].parsed;
                    if (-1 < iVar2) {
                      if ((g->flags & 0x10) == 0) {
                        if (iVar2 < iVar22) {
LAB_0010a4f6:
                          local_78[sVar18].i = iVar2;
                          local_78[sVar18].c = "~\x1b[22;31m";
                          sVar18 = sVar18 + 1;
                        }
                      }
                      else if (iVar22 < iVar2) goto LAB_0010a4f6;
                    }
                  }
                  if (sVar18 < 2) {
LAB_0010a5a7:
                    _cargo_xfree(&local_78);
                    goto LAB_0010a5b1;
                  }
                  _cargo_print_mutex_group_highlights(ctx,&local_60,local_78,sVar18);
                  pcVar15 = "TEST_mutex_order_group_before";
                  if ((g->flags & 0x10) == 0) {
                    pcVar15 = "TEST_mutex_order_group_after";
                  }
                  cargo_aappendf(&local_60,"These options must all be specified %s \"%s\":\n",
                                 pcVar15 + 0x17,local_40->name[0]);
                  _cargo_print_mutex_group(ctx,1,&local_60,g);
                }
                _cargo_xfree(&local_78);
                cVar8 = CARGO_PARSE_MUTEX_CONFLICT_ORDER;
                goto LAB_0010a72c;
              }
LAB_0010a5b1:
            }
            cVar9 = ctx->flags;
          }
          if ((cVar9 >> 0xd & 1) == 0) {
            cVar8 = _cargo_check_unknown_options_after(ctx);
            if (cVar8 != CARGO_PARSE_OK) goto LAB_0010a203;
            cVar9 = ctx->flags;
          }
          if ((cVar9 >> 8 & 1) == 0) {
            _cargo_parse_show_error(ctx);
          }
          goto LAB_0010a237;
        }
        cVar8 = CARGO_PARSE_UNKNOWN_OPTS;
      }
    }
  }
LAB_0010a203:
  cVar17 = cVar8;
  if (((ctx->unknown_opts_count == 0) && ((ctx->flags & CARGO_SKIP_CHECK_UNKNOWN) == 0)) &&
     (cVar8 = _cargo_check_unknown_options_after(ctx), cVar8 != CARGO_PARSE_OK)) {
    cVar17 = cVar8;
  }
  _cargo_parse_show_error(ctx);
  _cargo_cleanup_option_values(ctx,1);
LAB_0010a237:
  ctx->flags = cVar1;
  return cVar17;
}

Assistant:

int cargo_parse(cargo_t ctx, cargo_flags_t flags, int start_index, int argc, char **argv)
{
    int ret = CARGO_PARSE_OK;
    int start = 0;
    int opt_arg_count = 0;
    char *arg = NULL;
    const char *name = NULL;
    cargo_opt_t *opt = NULL;
    cargo_flags_t global_flags = ctx->flags;
    assert(ctx);

    // Override if any flags are set.
    if (flags)
    {
        ctx->flags = flags;
    }

    CARGODBG(2, "============ Cargo Parse =============\n");

    ctx->argc = argc;
    ctx->argv = argv;
    ctx->start = start_index;
    ctx->stopped = 0;
    ctx->stopped_hard = 0;

    _cargo_set_error(ctx, NULL);

    _cargo_add_help_if_missing(ctx);
    _cargo_add_orphans_to_default_group(ctx);

    _cargo_free_str_list(&ctx->args, NULL);
    ctx->arg_count = 0;

    _cargo_free_str_list(&ctx->unknown_opts, NULL);
    _cargo_xfree(&ctx->unknown_opts_idxs);
    ctx->unknown_opts_count = 0;

    // Make sure we start over, if this function is
    // called more than once.
    // (But we don't free the values since we don't want to
    //  overwrite default or already parsed values)
    _cargo_cleanup_option_values(ctx, 0);

    // TODO: Handle the case when argc == 0 (this will fail then).
    if (!(ctx->args = (char **)_cargo_calloc(argc, sizeof(char *))))
    {
        CARGODBG(1, "Out of memory!\n");
        ret = CARGO_PARSE_NOMEM; goto fail;
    }

    if (!(ctx->unknown_opts = (char **)_cargo_calloc(argc, sizeof(char *))))
    {
        CARGODBG(1, "Out of memory!\n");
        ret = CARGO_PARSE_NOMEM; goto fail;
    }

    if (!(ctx->unknown_opts_idxs = _cargo_calloc(argc, sizeof(int))))
    {
        CARGODBG(1, "Out of memory");
        ret = CARGO_PARSE_NOMEM; goto fail;
    }

    CARGODBG(2, "Parse arg list of count %d start at index %d\n", argc, start_index);

    // Check for unknown options early.
    if (!(ctx->flags & CARGO_SKIP_CHECK_UNKNOWN)
        && (ctx->flags & CARGO_UNKNOWN_EARLY)
        && _cargo_check_unknown_options(ctx))
    {
        ret = CARGO_PARSE_UNKNOWN_OPTS; goto fail;
    }

    for (ctx->i = ctx->start; ctx->i < ctx->argc; )
    {
        arg = argv[ctx->i];
        start = ctx->i;
        opt_arg_count = 0;

        CARGODBG(3, "\n");
        CARGODBG(3, "argv[%d] = %s\n", ctx->i, arg);
        CARGODBG(3, "  Look for opt matching %s:\n", arg);

        // TODO: Add support for a "--" option which forces all
        // options specified after it to be parsed as positional arguments
        // and not options. Say there's a file named "-thefile".

        // TODO: Add support for abbreviated prefix matching so that
        // --ar will match --arne unless it's ambigous with some other option.
        if (!ctx->stopped)
        {
            size_t opt_i = 0;
            int is_positional = 0;
            int is_combined = 0;

            // Look for options "--myoption 1 2 3"
            if (!(name = _cargo_find_full_option(ctx, &opt, arg)))
            {
                // Is this a set of combined short options?
                // -a -b -c -> -abc
                if ((is_combined = (_cargo_is_arg_combined_option(ctx, arg) != NULL)))
                {
                    size_t i;
                    const char *combined = NULL;

                    // Skip '-' by starting at 1.
                    for (i = 1; i < strlen(arg); i++)
                    {
                        combined = _cargo_find_short_option(ctx, &opt, arg[i]);
                        assert(combined != NULL);

                        if ((opt_arg_count = _cargo_parse_option(ctx, opt, combined,
                                                                argc, argv)) < 0)
                        {
                            CARGODBG(1, "Failed to parse %s option: %s\n",
                                    _cargo_type_to_str(opt->type), opt->name[0]);
                            ret = opt_arg_count; goto fail;
                        }
                    }
                }
                else
                {
                    // Or a positional argument "1 2 3"
                    // (just an argument that is parsed into a specific options target)
                    is_positional = !_cargo_get_positional(ctx, &opt_i);
                    opt = &ctx->options[opt_i];
                    CARGODBG(2, "    Positional argument: %s\n", argv[ctx->i]);
                }
            }

            if (name || is_positional)
            {
                // We found an option, parse any arguments it might have.
                if ((opt_arg_count = _cargo_parse_option(ctx, opt, name,
                                                        argc, argv)) < 0)
                {
                    CARGODBG(1, "Failed to parse %s option: %s\n",
                            _cargo_type_to_str(opt->type), opt->name[0]);
                    ret = opt_arg_count; goto fail;
                }
            }
            else if (!is_combined)
            {
                // A leftover argument that no option wants.
                opt_arg_count = _cargo_add_extra_arg(ctx);
            }
        }
        else
        {
            // Stopped parsing, so everything is saved as extra arguments.
            opt_arg_count = _cargo_add_extra_arg(ctx);
        }

        if (opt_arg_count == 0)
            opt_arg_count = 1;

        CARGODBG(3, "opt_arg_count == %d\n", opt_arg_count);

        ctx->i += opt_arg_count;

        #if CARGO_DEBUG
        _cargo_debug_print_eaten_args(ctx, start, opt_arg_count);
        #endif // CARGO_DEBUG
    }

    // Print automatic help.
    if (ctx->help)
    {
        cargo_print_usage(ctx, 0);
        ctx->flags = global_flags;
        return CARGO_PARSE_SHOW_HELP;
    }

    // An option can cause a "hard stop", meaning that there
    // won't be any errors for mutex groups and so on. This is
    // useful for cases where you have --advanced_help or similar
    // where you just want to show some extended help without also
    // having to specify required arguments.
    if (ctx->stopped_hard)
    {
        goto skip_checks;
    }

    if (!(ctx->flags & CARGO_SKIP_CHECK_REQUIRED)
        && _cargo_check_required_options(ctx))
    {
        ret = CARGO_PARSE_MISS_REQUIRED; goto fail;
    }

    if (!(ctx->flags & CARGO_SKIP_CHECK_MUTEX)
        && (ret = _cargo_check_mutex_groups(ctx)))
    {
        goto fail;
    }

    if (!(ctx->flags & CARGO_SKIP_CHECK_UNKNOWN)
        && (ret = _cargo_check_unknown_options_after(ctx)))
    {
        goto fail;
    }

    // Shows warnings.
    if (!(ctx->flags & CARGO_NOWARN))
    {
        _cargo_parse_show_error(ctx);
    }

skip_checks:
    ctx->flags = global_flags;
    return CARGO_PARSE_OK;

fail:
    // Let unknown options override other errors.
    // But don't check for them more than once.
    if (ctx->unknown_opts_count == 0)
    {
        int unknown_ret = 0;
        if (!(ctx->flags & CARGO_SKIP_CHECK_UNKNOWN)
            && (unknown_ret = _cargo_check_unknown_options_after(ctx)))
        {
            CARGODBG(1, "Unknown option overrides previous error\n");
            ret = unknown_ret;
        }
    }

    _cargo_parse_show_error(ctx);
    _cargo_cleanup_option_values(ctx, 1);
    ctx->flags = global_flags;
    return ret;
}